

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  Curl_easy *pCVar1;
  undefined4 *puVar2;
  ulong uVar3;
  CURLcode CVar4;
  ssize_t in_RAX;
  size_t len;
  char *pcVar5;
  bool bVar6;
  curltime cVar7;
  ssize_t bytes_written;
  
  pCVar1 = conn->data;
  puVar2 = (undefined4 *)(pCVar1->req).protop;
  if (puVar2 == (undefined4 *)0x0) {
    return CURLE_OK;
  }
  if ((conn->proto).ftpc.pp.conn != (connectdata *)0x0) {
    bytes_written = in_RAX;
    (*Curl_cfree)(*(void **)(puVar2 + 2));
    *(undefined8 *)(puVar2 + 2) = 0;
    if (status == CURLE_OK) {
      uVar3 = *(ulong *)&(pCVar1->set).field_0x888;
      status = CURLE_OK;
      if ((((uVar3 >> 0x25 & 1) == 0) && ((pCVar1->set).mail_rcpt != (curl_slist *)0x0)) &&
         ((((uint)uVar3 >> 0x1d & 1) != 0 || ((pCVar1->set).mimepost.kind != MIMEKIND_NONE)))) {
        if (*(char *)(puVar2 + 8) == '\0') {
          bVar6 = (conn->data->state).infilesize != 0;
          pcVar5 = "\r\n.\r\n";
          if (!bVar6) {
            pcVar5 = ".\r\n";
          }
          len = (ulong)bVar6 * 2 + 3;
        }
        else {
          len = 3;
          pcVar5 = ".\r\n";
        }
        pcVar5 = (*Curl_cstrdup)(pcVar5);
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar4 = Curl_write(conn,conn->writesockfd,pcVar5,len,&bytes_written);
        if (CVar4 != CURLE_OK) {
          (*Curl_cfree)(pcVar5);
          return CVar4;
        }
        if (len - bytes_written == 0) {
          cVar7 = Curl_now();
          (conn->proto).smbc.send_size = cVar7.tv_sec;
          *(int *)((long)&conn->proto + 0x48) = cVar7.tv_usec;
          (*Curl_cfree)(pcVar5);
        }
        else {
          (conn->proto).ftpc.pp.sendthis = pcVar5;
          (conn->proto).smbc.upload_size = len;
          (conn->proto).ftpc.pp.sendleft = len - bytes_written;
        }
        (conn->proto).imapc.state = IMAP_APPEND;
        status = smtp_block_statemach(conn,false);
      }
    }
    else {
      Curl_conncontrol(conn,1);
    }
    *puVar2 = 0;
    return status;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode smtp_done(struct connectdata *conn, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  struct pingpong *pp = &conn->proto.smtpc.pp;
  char *eob;
  ssize_t len;
  ssize_t bytes_written;

  (void)premature;

  if(!smtp || !pp->conn)
    return CURLE_OK;

  /* Cleanup our per-request based variables */
  Curl_safefree(smtp->custom);

  if(status) {
    connclose(conn, "SMTP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && data->set.mail_rcpt &&
          (data->set.upload || data->set.mimepost.kind)) {
    /* Calculate the EOB taking into account any terminating CRLF from the
       previous line of the email or the CRLF of the DATA command when there
       is "no mail data". RFC-5321, sect. 4.1.1.4.

       Note: As some SSL backends, such as OpenSSL, will cause Curl_write() to
       fail when using a different pointer following a previous write, that
       returned CURLE_AGAIN, we duplicate the EOB now rather than when the
       bytes written doesn't equal len. */
    if(smtp->trailing_crlf || !conn->data->state.infilesize) {
      eob = strdup(&SMTP_EOB[2]);
      len = SMTP_EOB_LEN - 2;
    }
    else {
      eob = strdup(SMTP_EOB);
      len = SMTP_EOB_LEN;
    }

    if(!eob)
      return CURLE_OUT_OF_MEMORY;

    /* Send the end of block data */
    result = Curl_write(conn, conn->writesockfd, eob, len, &bytes_written);
    if(result) {
      free(eob);
      return result;
    }

    if(bytes_written != len) {
      /* The whole chunk was not sent so keep it around and adjust the
         pingpong structure accordingly */
      pp->sendthis = eob;
      pp->sendsize = len;
      pp->sendleft = len - bytes_written;
    }
    else {
      /* Successfully sent so adjust the response timeout relative to now */
      pp->response = Curl_now();

      free(eob);
    }

    state(conn, SMTP_POSTDATA);

    /* Run the state-machine */
    result = smtp_block_statemach(conn, FALSE);
  }

  /* Clear the transfer mode for the next request */
  smtp->transfer = FTPTRANSFER_BODY;

  return result;
}